

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

uint8 get_marker(jpeg *j)

{
  uint8 uVar1;
  long in_RDI;
  uint8 x;
  undefined1 local_11;
  undefined1 local_1;
  
  if (*(char *)(in_RDI + 0x36e8) == -1) {
    uVar1 = get8u((stbi *)0x10ce1b);
    if (uVar1 == 0xff) {
      local_11 = 0xff;
      while (local_11 == 0xff) {
        local_11 = get8u((stbi *)0x10ce4a);
      }
      local_1 = local_11;
    }
    else {
      local_1 = 0xff;
    }
  }
  else {
    local_1 = *(uint8 *)(in_RDI + 0x36e8);
    *(undefined1 *)(in_RDI + 0x36e8) = 0xff;
  }
  return local_1;
}

Assistant:

static uint8 get_marker(jpeg *j)
{
   uint8 x;
   if (j->marker != MARKER_none) { x = j->marker; j->marker = MARKER_none; return x; }
   x = get8u(&j->s);
   if (x != 0xff) return MARKER_none;
   while (x == 0xff)
      x = get8u(&j->s);
   return x;
}